

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * triggersReallyExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  Trigger **ppTVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  Trigger *local_58;
  Trigger *local_48;
  Trigger *p;
  Trigger *pList;
  int mask;
  int *pMask_local;
  ExprList *pChanges_local;
  int op_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pList._4_4_ = 0;
  p = sqlite3TriggerList(pParse,pTab);
  if (p != (Trigger *)0x0) {
    local_48 = p;
    if (((pParse->db->flags & 0x40000) == 0) && (pTab->pTrigger != (Trigger *)0x0)) {
      if (p == pTab->pTrigger) {
        p = (Trigger *)0x0;
        goto LAB_0025d6e1;
      }
      while( true ) {
        bVar4 = false;
        if (local_48->pNext != (Trigger *)0x0) {
          bVar4 = local_48->pNext != pTab->pTrigger;
        }
        if (!bVar4) break;
        local_48 = local_48->pNext;
      }
      local_48->pNext = (Trigger *)0x0;
      local_48 = p;
    }
    do {
      if (((uint)local_48->op == op) &&
         (iVar2 = checkColumnOverlap(local_48->pColumns,pChanges), iVar2 != 0)) {
        pList._4_4_ = local_48->tr_tm | pList._4_4_;
      }
      else if (local_48->op == 0x96) {
        local_48->op = (u8)op;
        if (pTab->eTabType == '\x01') {
          if (op != 0x7f) {
            pcVar3 = "UPDATE";
            if (op == 0x80) {
              pcVar3 = "DELETE";
            }
            sqlite3ErrorMsg(pParse,"%s RETURNING is not available on virtual tables",pcVar3);
          }
          local_48->tr_tm = '\x01';
        }
        else {
          local_48->tr_tm = '\x02';
        }
        pList._4_4_ = local_48->tr_tm | pList._4_4_;
      }
      else if ((((local_48->bReturning != '\0') && (local_48->op == '\x7f')) && (op == 0x81)) &&
              (pParse->pToplevel == (Parse *)0x0)) {
        pList._4_4_ = local_48->tr_tm | pList._4_4_;
      }
      ppTVar1 = &local_48->pNext;
      local_48 = *ppTVar1;
    } while (*ppTVar1 != (Trigger *)0x0);
  }
LAB_0025d6e1:
  if (pMask != (int *)0x0) {
    *pMask = pList._4_4_;
  }
  if (pList._4_4_ == 0) {
    local_58 = (Trigger *)0x0;
  }
  else {
    local_58 = p;
  }
  return local_58;
}

Assistant:

static SQLITE_NOINLINE Trigger *triggersReallyExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  int mask = 0;
  Trigger *pList = 0;
  Trigger *p;

  pList = sqlite3TriggerList(pParse, pTab);
  assert( pList==0 || IsVirtual(pTab)==0
           || (pList->bReturning && pList->pNext==0) );
  if( pList!=0 ){
    p = pList;
    if( (pParse->db->flags & SQLITE_EnableTrigger)==0
     && pTab->pTrigger!=0
    ){
      /* The SQLITE_DBCONFIG_ENABLE_TRIGGER setting is off.  That means that
      ** only TEMP triggers are allowed.  Truncate the pList so that it
      ** includes only TEMP triggers */
      if( pList==pTab->pTrigger ){
        pList = 0;
        goto exit_triggers_exist;
      }
      while( ALWAYS(p->pNext) && p->pNext!=pTab->pTrigger ) p = p->pNext;
      p->pNext = 0;
      p = pList;
    }
    do{
      if( p->op==op && checkColumnOverlap(p->pColumns, pChanges) ){
        mask |= p->tr_tm;
      }else if( p->op==TK_RETURNING ){
        /* The first time a RETURNING trigger is seen, the "op" value tells
        ** us what time of trigger it should be. */
        assert( sqlite3IsToplevel(pParse) );
        p->op = op;
        if( IsVirtual(pTab) ){
          if( op!=TK_INSERT ){
            sqlite3ErrorMsg(pParse,
              "%s RETURNING is not available on virtual tables",
              op==TK_DELETE ? "DELETE" : "UPDATE");
          }
          p->tr_tm = TRIGGER_BEFORE;
        }else{
          p->tr_tm = TRIGGER_AFTER;
        }
        mask |= p->tr_tm;
      }else if( p->bReturning && p->op==TK_INSERT && op==TK_UPDATE
                && sqlite3IsToplevel(pParse) ){
        /* Also fire a RETURNING trigger for an UPSERT */
        mask |= p->tr_tm;
      }
      p = p->pNext;
    }while( p );
  }
exit_triggers_exist:
  if( pMask ){
    *pMask = mask;
  }
  return (mask ? pList : 0);
}